

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9CexInfo(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint fVerbose;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    do {
      iVar1 = Extra_UtilGetopt(argc,argv,"dvh");
    } while (iVar1 == 100);
    if (iVar1 == -1) break;
    if (iVar1 != 0x76) {
      Abc_Print(-2,"usage: &cexinfo [-vh]\n");
      Abc_Print(-2,"\t         prints information about the current counter-example\n");
      pcVar2 = "yes";
      if (fVerbose == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      pcVar2 = "\t-h     : print the command usage\n";
      iVar1 = -2;
LAB_00289116:
      Abc_Print(iVar1,pcVar2);
      return 1;
    }
    fVerbose = fVerbose ^ 1;
  }
  if (pAbc->pGia == (Gia_Man_t *)0x0) {
    pcVar2 = "Abc_CommandAbc9CexInfo(): There is no AIG.\n";
  }
  else {
    if (pAbc->pCex != (Abc_Cex_t *)0x0) {
      Bmc_CexTest(pAbc->pGia,pAbc->pCex,fVerbose);
      return 0;
    }
    pcVar2 = "Abc_CommandAbc9CexInfo(): There is no CEX.\n";
  }
  iVar1 = -1;
  goto LAB_00289116;
}

Assistant:

int Abc_CommandAbc9CexInfo( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Bmc_CexTest( Gia_Man_t * p, Abc_Cex_t * pCex, int fVerbose );
    int c, fDualOut = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "dvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'd':
            fDualOut ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9CexInfo(): There is no AIG.\n" );
        return 1;
    }
    if ( pAbc->pCex == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9CexInfo(): There is no CEX.\n" );
        return 1;
    }
    Bmc_CexTest( pAbc->pGia, pAbc->pCex, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &cexinfo [-vh]\n" );
    Abc_Print( -2, "\t         prints information about the current counter-example\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}